

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# partition_search.c
# Opt level: O1

void encode_sb(AV1_COMP *cpi,ThreadData_conflict *td,TileDataEnc *tile_data,TokenExtra **tp,
              int mi_row,int mi_col,RUN_TYPE dry_run,BLOCK_SIZE bsize,PC_TREE *pc_tree,int *rate)

{
  aom_cdf_prob *paVar1;
  byte partition;
  byte bVar2;
  ushort uVar3;
  ushort uVar4;
  FRAME_CONTEXT *pFVar5;
  bool bVar6;
  short sVar7;
  MACROBLOCK *pMVar8;
  BLOCK_SIZE bsize_00;
  byte bVar9;
  uint uVar10;
  ulong uVar11;
  long lVar12;
  BLOCK_SIZE bsize_01;
  long lVar13;
  int iVar14;
  ulong uVar15;
  ulong uVar16;
  uint uVar17;
  int iVar18;
  ulong uVar19;
  int *in_stack_ffffffffffffff60;
  PICK_MODE_CONTEXT *ctx;
  ThreadData_conflict *pTVar20;
  
  uVar11 = (ulong)bsize;
  uVar10 = 0xffffffff;
  if (2 < uVar11) {
    uVar10 = ""[uVar11] - 1;
    uVar10 = ((uint)(((uint)(int)(td->mb).e_mbd.above_partition_context[mi_col] >> (uVar10 & 0x1f) &
                     1) != 0) +
              ((uint)(int)(td->mb).e_mbd.left_partition_context[mi_row & 0x1f] >>
               ((byte)uVar10 & 0x1f) & 1) * 2 + (uint)""[uVar11] * 4) - 4;
  }
  partition = pc_tree->partitioning;
  uVar19 = (ulong)partition;
  bsize_00 = BLOCK_INVALID;
  uVar16 = (ulong)bsize;
  if (uVar19 == 0xff) goto LAB_0030b7cb;
  switch(uVar16) {
  case 0:
    bVar6 = false;
    uVar15 = uVar16;
    goto LAB_0030b7b3;
  case 1:
  case 2:
  case 4:
  case 5:
  case 7:
  case 8:
switchD_0030b76b_caseD_1:
    bVar6 = true;
    uVar15 = 6;
    goto LAB_0030b7b3;
  case 3:
    uVar15 = 1;
    break;
  case 6:
    uVar15 = 2;
    break;
  case 9:
    uVar15 = 3;
    break;
  default:
    if (bsize == BLOCK_64X64) {
      uVar15 = 4;
    }
    else {
      if (bsize != BLOCK_128X128) goto switchD_0030b76b_caseD_1;
      uVar15 = 5;
    }
  }
  bVar6 = false;
LAB_0030b7b3:
  if (!bVar6) {
    bsize_00 = subsize_lookup[uVar19][uVar15];
  }
LAB_0030b7cb:
  switch(uVar16) {
  case 0:
    bVar6 = false;
    goto LAB_0030b826;
  case 1:
  case 2:
  case 4:
  case 5:
  case 7:
  case 8:
switchD_0030b7de_caseD_1:
    uVar16 = 6;
    bVar6 = true;
    goto LAB_0030b826;
  case 3:
    uVar16 = 1;
    break;
  case 6:
    uVar16 = 2;
    break;
  case 9:
    uVar16 = 3;
    break;
  default:
    if (bsize == BLOCK_64X64) {
      uVar16 = 4;
    }
    else {
      if (bsize != BLOCK_128X128) goto switchD_0030b7de_caseD_1;
      uVar16 = 5;
    }
  }
  bVar6 = false;
LAB_0030b826:
  bsize_01 = BLOCK_INVALID;
  if (!bVar6) {
    bsize_01 = subsize_lookup[3][uVar16];
  }
  iVar18 = (cpi->common).mi_params.mi_rows;
  if (((iVar18 <= mi_row) || (iVar14 = (cpi->common).mi_params.mi_cols, iVar14 <= mi_col)) ||
     (bsize_00 == BLOCK_INVALID)) {
    return;
  }
  bVar2 = "\x01\x01\x02\x02\x02\x04\x04\x04\b\b\b\x10\x10\x10  \x01\x04\x02\b\x04\x10"[uVar11];
  uVar17 = (uint)(bVar2 >> 1);
  if (((dry_run == '\0') && (-1 < (int)uVar10)) &&
     (((int)(mi_col + uVar17) < iVar14 && (int)(mi_row + uVar17) < iVar18 &&
      (tile_data->allow_update_cdf != '\0')))) {
    pFVar5 = (td->mb).e_mbd.tile_ctx;
    uVar11 = 4;
    if (BLOCK_8X8 < bsize) {
      uVar11 = (ulong)((uint)(bsize != BLOCK_128X128) * 2 + 8);
    }
    uVar3 = pFVar5->partition_cdf[uVar10][uVar11];
    bVar9 = (char)(uVar3 >> 4) + 5;
    uVar16 = 0;
    do {
      uVar4 = pFVar5->partition_cdf[uVar10][uVar16];
      if ((long)uVar16 < (long)(char)partition) {
        sVar7 = (short)((int)(0x8000 - (uint)uVar4) >> (bVar9 & 0x1f));
      }
      else {
        sVar7 = -(uVar4 >> (bVar9 & 0x1f));
      }
      pFVar5->partition_cdf[uVar10][uVar16] = sVar7 + uVar4;
      uVar16 = uVar16 + 1;
    } while ((int)uVar11 - 1 != uVar16);
    paVar1 = pFVar5->partition_cdf[uVar10] + uVar11;
    *paVar1 = *paVar1 + (ushort)(uVar3 < 0x20);
  }
  pMVar8 = &td->mb;
  if (9 < partition) goto LAB_0030bf3f;
  bVar2 = bVar2 >> 2;
  iVar18 = mi_row;
  iVar14 = mi_col;
  switch(uVar19) {
  case 0:
    ctx = pc_tree->none;
    pTVar20 = td;
    bsize_01 = bsize_00;
    break;
  case 1:
    encode_b(cpi,tile_data,td,tp,mi_row,mi_col,dry_run,bsize_00,partition,pc_tree->horizontal[0],
             (int *)td);
    iVar18 = uVar17 + mi_row;
    if ((cpi->common).mi_params.mi_rows <= iVar18) goto LAB_0030bf3f;
    ctx = pc_tree->horizontal[1];
    pTVar20 = td;
    bsize_01 = bsize_00;
    break;
  case 2:
    encode_b(cpi,tile_data,td,tp,mi_row,mi_col,dry_run,bsize_00,partition,pc_tree->vertical[0],
             (int *)td);
    if ((cpi->common).mi_params.mi_cols <= (int)(uVar17 + mi_col)) goto LAB_0030bf3f;
    ctx = pc_tree->vertical[1];
    iVar14 = uVar17 + mi_col;
    pTVar20 = td;
    bsize_01 = bsize_00;
    break;
  case 3:
    pTVar20 = td;
    encode_sb(cpi,td,tile_data,tp,mi_row,mi_col,dry_run,bsize_00,pc_tree->split[0],
              in_stack_ffffffffffffff60);
    encode_sb(cpi,td,tile_data,tp,mi_row,mi_col + uVar17,dry_run,bsize_00,pc_tree->split[1],
              in_stack_ffffffffffffff60);
    encode_sb(cpi,pTVar20,tile_data,tp,uVar17 + mi_row,mi_col,dry_run,bsize_00,pc_tree->split[2],
              in_stack_ffffffffffffff60);
    encode_sb(cpi,pTVar20,tile_data,tp,uVar17 + mi_row,mi_col + uVar17,dry_run,bsize_00,
              pc_tree->split[3],in_stack_ffffffffffffff60);
    goto LAB_0030bf3f;
  case 4:
    encode_b(cpi,tile_data,td,tp,mi_row,mi_col,dry_run,bsize_01,partition,pc_tree->horizontala[0],
             (int *)td);
    pTVar20 = td;
    encode_b(cpi,tile_data,td,tp,mi_row,mi_col + uVar17,dry_run,bsize_01,partition,
             pc_tree->horizontala[1],(int *)td);
    ctx = pc_tree->horizontala[2];
    iVar18 = uVar17 + mi_row;
    bsize_01 = bsize_00;
    break;
  case 5:
    encode_b(cpi,tile_data,td,tp,mi_row,mi_col,dry_run,bsize_00,partition,pc_tree->horizontalb[0],
             (int *)td);
    encode_b(cpi,tile_data,td,tp,mi_row + uVar17,mi_col,dry_run,bsize_01,partition,
             pc_tree->horizontalb[1],(int *)td);
    ctx = pc_tree->horizontalb[2];
    iVar18 = mi_row + uVar17;
    iVar14 = uVar17 + mi_col;
    pTVar20 = td;
    break;
  case 6:
    encode_b(cpi,tile_data,td,tp,mi_row,mi_col,dry_run,bsize_01,partition,pc_tree->verticala[0],
             (int *)td);
    encode_b(cpi,tile_data,td,tp,mi_row + uVar17,mi_col,dry_run,bsize_01,partition,
             pc_tree->verticala[1],(int *)td);
    ctx = pc_tree->verticala[2];
    iVar14 = uVar17 + mi_col;
    pTVar20 = td;
    bsize_01 = bsize_00;
    break;
  case 7:
    encode_b(cpi,tile_data,td,tp,mi_row,mi_col,dry_run,bsize_00,partition,pc_tree->verticalb[0],
             (int *)td);
    pTVar20 = td;
    encode_b(cpi,tile_data,td,tp,mi_row,mi_col + uVar17,dry_run,bsize_01,partition,
             pc_tree->verticalb[1],(int *)td);
    ctx = pc_tree->verticalb[2];
    iVar18 = uVar17 + mi_row;
    iVar14 = mi_col + uVar17;
    break;
  case 8:
    lVar12 = (long)mi_row;
    lVar13 = 0;
    do {
      if ((lVar13 != 0) && ((cpi->common).mi_params.mi_rows <= lVar12)) break;
      encode_b(cpi,tile_data,td,tp,(int)lVar12,mi_col,dry_run,bsize_00,partition,
               pc_tree->horizontal4[lVar13],(int *)td);
      lVar13 = lVar13 + 1;
      lVar12 = lVar12 + (ulong)bVar2;
    } while (lVar13 != 4);
    goto LAB_0030bf3f;
  case 9:
    lVar13 = (long)mi_col;
    lVar12 = 0;
    do {
      if ((lVar12 != 0) && ((cpi->common).mi_params.mi_cols <= lVar13)) break;
      encode_b(cpi,tile_data,td,tp,mi_row,(int)lVar13,dry_run,bsize_00,partition,
               pc_tree->vertical4[lVar12],(int *)td);
      lVar12 = lVar12 + 1;
      lVar13 = lVar13 + (ulong)bVar2;
    } while (lVar12 != 4);
    goto LAB_0030bf3f;
  }
  encode_b(cpi,tile_data,td,tp,iVar18,iVar14,dry_run,bsize_01,partition,ctx,(int *)pTVar20);
LAB_0030bf3f:
  update_ext_partition_context(&pMVar8->e_mbd,mi_row,mi_col,bsize_00,bsize,partition);
  return;
}

Assistant:

static void encode_sb(const AV1_COMP *const cpi, ThreadData *td,
                      TileDataEnc *tile_data, TokenExtra **tp, int mi_row,
                      int mi_col, RUN_TYPE dry_run, BLOCK_SIZE bsize,
                      PC_TREE *pc_tree, int *rate) {
  assert(bsize < BLOCK_SIZES_ALL);
  const AV1_COMMON *const cm = &cpi->common;
  const CommonModeInfoParams *const mi_params = &cm->mi_params;
  MACROBLOCK *const x = &td->mb;
  MACROBLOCKD *const xd = &x->e_mbd;
  assert(bsize < BLOCK_SIZES_ALL);
  const int hbs = mi_size_wide[bsize] / 2;
  const int is_partition_root = bsize >= BLOCK_8X8;
  const int ctx = is_partition_root
                      ? partition_plane_context(xd, mi_row, mi_col, bsize)
                      : -1;
  const PARTITION_TYPE partition = pc_tree->partitioning;
  const BLOCK_SIZE subsize = get_partition_subsize(bsize, partition);
#if !CONFIG_REALTIME_ONLY
  int quarter_step = mi_size_wide[bsize] / 4;
  int i;
  BLOCK_SIZE bsize2 = get_partition_subsize(bsize, PARTITION_SPLIT);
#endif

  if (mi_row >= mi_params->mi_rows || mi_col >= mi_params->mi_cols) return;
  if (subsize == BLOCK_INVALID) return;

  if (!dry_run && ctx >= 0) {
    const int has_rows = (mi_row + hbs) < mi_params->mi_rows;
    const int has_cols = (mi_col + hbs) < mi_params->mi_cols;

    if (has_rows && has_cols) {
#if CONFIG_ENTROPY_STATS
      td->counts->partition[ctx][partition]++;
#endif

      if (tile_data->allow_update_cdf) {
        FRAME_CONTEXT *fc = xd->tile_ctx;
        update_cdf(fc->partition_cdf[ctx], partition,
                   partition_cdf_length(bsize));
      }
    }
  }

  switch (partition) {
    case PARTITION_NONE:
      encode_b(cpi, tile_data, td, tp, mi_row, mi_col, dry_run, subsize,
               partition, pc_tree->none, rate);
      break;
    case PARTITION_VERT:
      encode_b(cpi, tile_data, td, tp, mi_row, mi_col, dry_run, subsize,
               partition, pc_tree->vertical[0], rate);
      if (mi_col + hbs < mi_params->mi_cols) {
        encode_b(cpi, tile_data, td, tp, mi_row, mi_col + hbs, dry_run, subsize,
                 partition, pc_tree->vertical[1], rate);
      }
      break;
    case PARTITION_HORZ:
      encode_b(cpi, tile_data, td, tp, mi_row, mi_col, dry_run, subsize,
               partition, pc_tree->horizontal[0], rate);
      if (mi_row + hbs < mi_params->mi_rows) {
        encode_b(cpi, tile_data, td, tp, mi_row + hbs, mi_col, dry_run, subsize,
                 partition, pc_tree->horizontal[1], rate);
      }
      break;
    case PARTITION_SPLIT:
      encode_sb(cpi, td, tile_data, tp, mi_row, mi_col, dry_run, subsize,
                pc_tree->split[0], rate);
      encode_sb(cpi, td, tile_data, tp, mi_row, mi_col + hbs, dry_run, subsize,
                pc_tree->split[1], rate);
      encode_sb(cpi, td, tile_data, tp, mi_row + hbs, mi_col, dry_run, subsize,
                pc_tree->split[2], rate);
      encode_sb(cpi, td, tile_data, tp, mi_row + hbs, mi_col + hbs, dry_run,
                subsize, pc_tree->split[3], rate);
      break;

#if !CONFIG_REALTIME_ONLY
    case PARTITION_HORZ_A:
      encode_b(cpi, tile_data, td, tp, mi_row, mi_col, dry_run, bsize2,
               partition, pc_tree->horizontala[0], rate);
      encode_b(cpi, tile_data, td, tp, mi_row, mi_col + hbs, dry_run, bsize2,
               partition, pc_tree->horizontala[1], rate);
      encode_b(cpi, tile_data, td, tp, mi_row + hbs, mi_col, dry_run, subsize,
               partition, pc_tree->horizontala[2], rate);
      break;
    case PARTITION_HORZ_B:
      encode_b(cpi, tile_data, td, tp, mi_row, mi_col, dry_run, subsize,
               partition, pc_tree->horizontalb[0], rate);
      encode_b(cpi, tile_data, td, tp, mi_row + hbs, mi_col, dry_run, bsize2,
               partition, pc_tree->horizontalb[1], rate);
      encode_b(cpi, tile_data, td, tp, mi_row + hbs, mi_col + hbs, dry_run,
               bsize2, partition, pc_tree->horizontalb[2], rate);
      break;
    case PARTITION_VERT_A:
      encode_b(cpi, tile_data, td, tp, mi_row, mi_col, dry_run, bsize2,
               partition, pc_tree->verticala[0], rate);
      encode_b(cpi, tile_data, td, tp, mi_row + hbs, mi_col, dry_run, bsize2,
               partition, pc_tree->verticala[1], rate);
      encode_b(cpi, tile_data, td, tp, mi_row, mi_col + hbs, dry_run, subsize,
               partition, pc_tree->verticala[2], rate);

      break;
    case PARTITION_VERT_B:
      encode_b(cpi, tile_data, td, tp, mi_row, mi_col, dry_run, subsize,
               partition, pc_tree->verticalb[0], rate);
      encode_b(cpi, tile_data, td, tp, mi_row, mi_col + hbs, dry_run, bsize2,
               partition, pc_tree->verticalb[1], rate);
      encode_b(cpi, tile_data, td, tp, mi_row + hbs, mi_col + hbs, dry_run,
               bsize2, partition, pc_tree->verticalb[2], rate);
      break;
    case PARTITION_HORZ_4:
      for (i = 0; i < SUB_PARTITIONS_PART4; ++i) {
        int this_mi_row = mi_row + i * quarter_step;
        if (i > 0 && this_mi_row >= mi_params->mi_rows) break;

        encode_b(cpi, tile_data, td, tp, this_mi_row, mi_col, dry_run, subsize,
                 partition, pc_tree->horizontal4[i], rate);
      }
      break;
    case PARTITION_VERT_4:
      for (i = 0; i < SUB_PARTITIONS_PART4; ++i) {
        int this_mi_col = mi_col + i * quarter_step;
        if (i > 0 && this_mi_col >= mi_params->mi_cols) break;
        encode_b(cpi, tile_data, td, tp, mi_row, this_mi_col, dry_run, subsize,
                 partition, pc_tree->vertical4[i], rate);
      }
      break;
#endif
    default: assert(0 && "Invalid partition type."); break;
  }

  update_ext_partition_context(xd, mi_row, mi_col, subsize, bsize, partition);
}